

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

ssize_t __thiscall
fmt::v5::internal::
arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::write
          (arg_formatter_base<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  uint uVar2;
  format_specs *spec;
  basic_buffer<wchar_t> *pbVar3;
  size_t sVar4;
  int iVar5;
  size_t sVar6;
  size_t extraout_RAX;
  undefined4 extraout_var;
  void *pvVar8;
  format_error *this_00;
  wchar_t *data;
  undefined4 in_register_00000034;
  wchar_t *__s;
  str_writer<wchar_t> local_38;
  size_t sVar7;
  
  __s = (wchar_t *)CONCAT44(in_register_00000034,__fd);
  if (__s == (wchar_t *)0x0) {
    this_00 = (format_error *)__cxa_allocate_exception(0x10);
    format_error::format_error(this_00,"string pointer is null");
    __cxa_throw(this_00,&format_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar6 = wcslen(__s);
  spec = this->specs_;
  if (spec == (format_specs *)0x0) {
    pbVar3 = (this->writer_).out_.container;
    sVar4 = pbVar3->size_;
    uVar1 = sVar4 + sVar6;
    sVar7 = sVar6;
    if (pbVar3->capacity_ < uVar1) {
      iVar5 = (**pbVar3->_vptr_basic_buffer)(pbVar3,uVar1);
      sVar7 = CONCAT44(extraout_var,iVar5);
    }
    pbVar3->size_ = uVar1;
    if (sVar6 != 0) {
      pvVar8 = memmove(pbVar3->ptr_ + sVar4,__s,sVar6 << 2);
      return (ssize_t)pvVar8;
    }
  }
  else {
    uVar2 = (spec->super_core_format_specs).precision;
    local_38.size_ = (ulong)uVar2;
    if (sVar6 <= uVar2) {
      local_38.size_ = sVar6;
    }
    if ((int)uVar2 < 0) {
      local_38.size_ = sVar6;
    }
    local_38.s = __s;
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::str_writer<wchar_t>>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *
               )this,&spec->super_align_spec,&local_38);
    sVar7 = extraout_RAX;
  }
  return sVar7;
}

Assistant:

void write(const char_type *value) {
    if (!value)
      FMT_THROW(format_error("string pointer is null"));
    auto length = std::char_traits<char_type>::length(value);
    basic_string_view<char_type> sv(value, length);
    specs_ ? writer_.write(sv, *specs_) : writer_.write(sv);
  }